

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_profile_room(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  void *pvVar4;
  char *pcVar5;
  ulong local_30;
  size_t i;
  room_profile *r;
  cave_profile *c;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  i = *(size_t *)((long)pvVar3 + 0x70);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if (i == 0) {
      pvVar4 = mem_zalloc(0x38);
      *(void **)((long)pvVar3 + 0x70) = pvVar4;
      i = *(size_t *)((long)pvVar3 + 0x70);
    }
    else {
      for (; *(long *)i != 0; i = *(size_t *)i) {
      }
      pvVar3 = mem_zalloc(0x38);
      *(void **)i = pvVar3;
      i = *(size_t *)i;
    }
    pcVar5 = parser_getsym(p,"name");
    pcVar5 = string_make(pcVar5);
    *(char **)(i + 8) = pcVar5;
    local_30 = 0;
    while ((local_30 < 0x24 &&
           (iVar1 = strcmp(*(char **)(i + 8),room_builders[local_30].name), iVar1 != 0))) {
      local_30 = local_30 + 1;
    }
    if (local_30 == 0x24) {
      p_local._4_4_ = PARSE_ERROR_NO_ROOM_FOUND;
    }
    else {
      *(room_builder_conflict *)(i + 0x10) = room_builders[local_30].builder;
      wVar2 = parser_getint(p,"rating");
      *(wchar_t *)(i + 0x18) = wVar2;
      wVar2 = parser_getint(p,"height");
      *(wchar_t *)(i + 0x1c) = wVar2;
      wVar2 = parser_getint(p,"width");
      *(wchar_t *)(i + 0x20) = wVar2;
      wVar2 = parser_getint(p,"level");
      *(wchar_t *)(i + 0x24) = wVar2;
      wVar2 = parser_getint(p,"pit");
      *(bool *)(i + 0x28) = wVar2 == L'\x01';
      wVar2 = parser_getint(p,"rarity");
      *(wchar_t *)(i + 0x2c) = wVar2;
      wVar2 = parser_getint(p,"cutoff");
      *(wchar_t *)(i + 0x30) = wVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_profile_room(struct parser *p) {
	struct cave_profile *c = parser_priv(p);
	struct room_profile *r = c->room_profiles;
	size_t i;

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* Go to the last valid room profile, then allocate a new one */
	if (!r) {
		c->room_profiles = mem_zalloc(sizeof(struct room_profile));
		r = c->room_profiles;
	} else {
		while (r->next)
			r = r->next;
		r->next = mem_zalloc(sizeof(struct room_profile));
		r = r->next;
	}

	/* Now read the data */
	r->name = string_make(parser_getsym(p, "name"));
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq(r->name, room_builders[i].name))
			break;

	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	r->builder = room_builders[i].builder;
	r->rating = parser_getint(p, "rating");
	r->height = parser_getint(p, "height");
	r->width = parser_getint(p, "width");
	r->level = parser_getint(p, "level");
	r->pit = (parser_getint(p, "pit") == 1);
	r->rarity = parser_getint(p, "rarity");
	r->cutoff = parser_getint(p, "cutoff");
	return PARSE_ERROR_NONE;
}